

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O3

err_t cmdSigSelfVerify2(octet *anchor,size_t anchor_len)

{
  err_t eVar1;
  size_t in_RAX;
  char *path;
  size_t count;
  size_t local_28;
  
  local_28 = in_RAX;
  eVar1 = cmdSysModulePath((char *)0x0,&local_28);
  if (eVar1 == 0) {
    path = (char *)blobCreate(local_28);
    if (path == (char *)0x0) {
      eVar1 = 0x6e;
    }
    else {
      eVar1 = cmdSysModulePath(path,&local_28);
      if (eVar1 == 0) {
        eVar1 = cmdSigVerify2(path,path,anchor,anchor_len);
      }
      blobClose(path);
    }
  }
  return eVar1;
}

Assistant:

err_t cmdSigSelfVerify2(const octet anchor[], size_t anchor_len)
{
	err_t code;
	size_t count;
	char* buf;
	// определить имя исполняемого модуля
	code = cmdSysModulePath(0, &count);
	ERR_CALL_CHECK(code);
	code = cmdBlobCreate(buf, count);
	ERR_CALL_CHECK(code);
	code = cmdSysModulePath(buf, &count);
	ERR_CALL_HANDLE(code, cmdBlobClose(buf));
	// проверить подпись
	code = cmdSigVerify2(buf, buf, anchor, anchor_len);
	// завершить
	cmdBlobClose(buf);
	return code;
}